

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlErrValid(xmlValidCtxtPtr ctxt,xmlParserErrors error,char *msg,char *extra)

{
  long lVar1;
  long delta;
  void *data;
  xmlParserCtxtPtr pctxt;
  xmlGenericErrorFunc channel;
  char *extra_local;
  char *msg_local;
  xmlParserErrors error_local;
  xmlValidCtxtPtr ctxt_local;
  
  pctxt = (xmlParserCtxtPtr)0x0;
  data = (void *)0x0;
  delta = 0;
  if (ctxt != (xmlValidCtxtPtr)0x0) {
    pctxt = (xmlParserCtxtPtr)ctxt->error;
    delta = (long)ctxt->userData;
    if ((((ctxt->flags & 2) != 0) && (lVar1 = (long)ctxt - (long)ctxt->userData, 0 < lVar1)) &&
       (lVar1 < 0xfa)) {
      data = ctxt->userData;
    }
  }
  if (extra == (char *)0x0) {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)pctxt,(void *)delta,data,
                    (void *)0x0,0x17,error,XML_ERR_ERROR,(char *)0x0,0,(char *)0x0,(char *)0x0,
                    (char *)0x0,0,0,"%s",msg);
  }
  else {
    __xmlRaiseError((xmlStructuredErrorFunc)0x0,(xmlGenericErrorFunc)pctxt,(void *)delta,data,
                    (void *)0x0,0x17,error,XML_ERR_ERROR,(char *)0x0,0,extra,(char *)0x0,(char *)0x0
                    ,0,0,msg,extra);
  }
  return;
}

Assistant:

static void LIBXML_ATTR_FORMAT(3,0)
xmlErrValid(xmlParserCtxtPtr ctxt, xmlParserErrors error,
            const char *msg, const char *str1, const char *str2)
{
    xmlStructuredErrorFunc schannel = NULL;

    if ((ctxt != NULL) && (ctxt->disableSAX != 0) &&
        (ctxt->instate == XML_PARSER_EOF))
	return;
    if (ctxt != NULL) {
	ctxt->errNo = error;
	if ((ctxt->sax != NULL) && (ctxt->sax->initialized == XML_SAX2_MAGIC))
	    schannel = ctxt->sax->serror;
	__xmlRaiseError(schannel,
			ctxt->vctxt.error, ctxt->vctxt.userData,
			ctxt, NULL, XML_FROM_DTD, error,
			XML_ERR_ERROR, NULL, 0, (const char *) str1,
			(const char *) str2, NULL, 0, 0,
			msg, (const char *) str1, (const char *) str2);
	ctxt->valid = 0;
    }